

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArbitraryInteger.cpp
# Opt level: O1

TCompareResult __thiscall
Refal2::CArbitraryInteger::compare(CArbitraryInteger *this,CArbitraryInteger *operand)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  TCompareResult TVar5;
  pointer puVar6;
  pointer puVar7;
  ulong uVar8;
  ulong uVar9;
  
  puVar1 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar8 = (long)puVar2 - (long)puVar1 >> 2;
  puVar3 = (operand->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (operand->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar9 = (long)puVar4 - (long)puVar3 >> 2;
  TVar5 = CR_Less;
  if (uVar9 <= uVar8) {
    TVar5 = CR_Great;
    if (uVar8 <= uVar9) {
      if (uVar9 != uVar8) {
        __assert_fail("operand.size() == size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/ArbitraryInteger.cpp"
                      ,0x109,
                      "CArbitraryInteger::TCompareResult Refal2::CArbitraryInteger::compare(const CArbitraryInteger &) const"
                     );
      }
      do {
        puVar7 = puVar2;
        puVar6 = puVar4;
        if (puVar7 == puVar1) break;
        puVar4 = puVar6 + -1;
        puVar2 = puVar7 + -1;
      } while (puVar7[-1] == puVar6[-1]);
      if (puVar7 == puVar1) {
        TVar5 = CR_Equal;
        if (puVar6 != puVar3) {
          __assert_fail("j == operand.crend()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/ArbitraryInteger.cpp"
                        ,0x111,
                        "CArbitraryInteger::TCompareResult Refal2::CArbitraryInteger::compare(const CArbitraryInteger &) const"
                       );
        }
      }
      else {
        if (puVar7[-1] == puVar6[-1]) {
          __assert_fail("*i != *j",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/ArbitraryInteger.cpp"
                        ,0x114,
                        "CArbitraryInteger::TCompareResult Refal2::CArbitraryInteger::compare(const CArbitraryInteger &) const"
                       );
        }
        TVar5 = -(uint)(puVar7[-1] < puVar6[-1]) | CR_Great;
      }
    }
  }
  return TVar5;
}

Assistant:

CArbitraryInteger::TCompareResult CArbitraryInteger::compare(
	const CArbitraryInteger& operand ) const
{
	if( size() < operand.size() ) {
		return CR_Less;
	} else if( operand.size() < size() ) {
		return CR_Great;
	} else {
		assert( operand.size() == size() );
		const_reverse_iterator i = crbegin();
		const_reverse_iterator j = operand.crbegin();
		while( i != crend() && *i == *j ) {
			++i;
			++j;
		}
		if( i == crend() ) {
			assert( j == operand.crend() );
			return CR_Equal;
		}
		assert( *i != *j );
		return ( *i < *j ? CR_Less : CR_Great );
	}
}